

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CHARACTER::OMultiplyAndAssign(_Type_CHARACTER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  uint uVar2;
  Object *pOVar3;
  Type *pTVar4;
  Number *pNVar5;
  Character *pCVar6;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar7;
  Variable VVar8;
  String local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  Variable tmp;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_CHARACTER *this_local;
  
  tmp.nb_ref = (uint *)in_RCX;
  pOVar3 = Variable::operator->(in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar1 = Type::operator!=(pTVar4,(Type *)_type_number);
  if (bVar1) {
    Variable::Convert((Variable *)local_38,(Type *)tmp.nb_ref);
    pOVar3 = Variable::operator->((Variable *)local_38);
    pTVar4 = Object::GetType(pOVar3);
    bVar1 = Type::operator==(pTVar4,(Type *)_type_number);
    if (bVar1) {
      pOVar3 = Variable::operator->((Variable *)local_38);
      pNVar5 = Object::GetData<LiteScript::Number>(pOVar3);
      uVar2 = Number::operator_cast_to_int(pNVar5);
      pOVar3 = Variable::operator->(obj2);
      pCVar6 = Object::GetData<LiteScript::Character>(pOVar3);
      Character::operator*=(pCVar6,uVar2);
      Variable::Variable((Variable *)this,obj2);
    }
    else {
      String::String(&local_68,"");
      pOVar3 = Variable::operator->(obj2);
      pCVar6 = Object::GetData<LiteScript::Character>(pOVar3);
      Character::operator+=(pCVar6,&local_68);
      String::~String(&local_68);
      Variable::Variable((Variable *)this,obj2);
    }
    local_48 = 1;
    Variable::~Variable((Variable *)local_38);
    puVar7 = extraout_RDX;
  }
  else {
    pOVar3 = Variable::operator->((Variable *)tmp.nb_ref);
    pNVar5 = Object::GetData<LiteScript::Number>(pOVar3);
    uVar2 = Number::operator_cast_to_int(pNVar5);
    pOVar3 = Variable::operator->(obj2);
    pCVar6 = Object::GetData<LiteScript::Character>(pOVar3);
    Character::operator*=(pCVar6,uVar2);
    Variable::Variable((Variable *)this,obj2);
    puVar7 = extraout_RDX_00;
  }
  VVar8.nb_ref = puVar7;
  VVar8.obj = (Object *)this;
  return VVar8;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OMultiplyAndAssign(LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::NUMBER) {
        Variable tmp = obj2.Convert(Type::NUMBER);
        if (tmp->GetType() == Type::NUMBER) {
            obj1->GetData<Character>() *= (unsigned int) (int) tmp->GetData<Number>();
            return obj1;
        }
        obj1->GetData<Character>() += String("");
        return obj1;
    }
    obj1->GetData<Character>() *= (unsigned int)(int)obj2->GetData<Number>();
    return obj1;
}